

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall
amrex::FillPatchIterator::Initialize
          (FillPatchIterator *this,int boxGrow,Real time,int idx,int scomp,int ncomp)

{
  MultiFab *this_00;
  IntVect *this_01;
  IntVect *this_02;
  int ncomp_00;
  int iVar1;
  MultiFab *pMVar2;
  AmrLevel *pAVar3;
  pointer pIVar4;
  undefined8 uVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  pointer ppVar9;
  InterpBase *pIVar10;
  IndexSpace *pIVar11;
  FillPatchIteratorHelper *this_03;
  long lVar12;
  int *piVar13;
  uint uVar14;
  int dcomp;
  int iVar15;
  IntVect local_208;
  int local_1fc;
  int local_1f8;
  IndexType local_1f4;
  Real local_1f0;
  StateDescriptor *local_1e8;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  FabArrayBase *local_1d0;
  MultiFab *local_1c8;
  AmrLevel *local_1c0;
  MFIter mfi;
  
  local_1f0 = time;
  local_1e8 = DescriptorList::operator[]((DescriptorList *)AmrLevel::desc_lst,idx);
  this->m_ncomp = ncomp;
  StateDescriptor::sameInterps
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&mfi,local_1e8,
             scomp,ncomp);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign
            (&this->m_range,&mfi);
  pvVar6 = (void *)CONCAT44(mfi.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                            mfi.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_)
  ;
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,mfi.tile_size.vect._0_8_ - (long)pvVar6);
  }
  this_00 = &this->m_fabs;
  pMVar2 = this->m_leveldata;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  MultiFab::define(this_00,&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                   &(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                   this->m_ncomp,boxGrow,(MFInfo *)&mfi,
                   (pMVar2->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
                  );
  local_1dc = scomp;
  local_1d8 = ncomp;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  uVar14 = 0;
  FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
            (&this_00->super_FabArray<amrex::FArrayBox>,NAN,0,
             (this->m_fabs).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &this->m_amrlevel->geom);
  lVar12 = 0xc;
  switch((this->m_leveldata->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
         m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  default:
    lVar12 = 0x10;
  case indexType:
  case indexType_coarsenRatio:
    uVar14 = *(uint *)((long)&(this->m_leveldata->super_FabArray<amrex::FArrayBox>).
                              super_FabArrayBase._vptr_FabArrayBase + lVar12);
  }
  ppVar9 = (this->m_range).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1f4.itype = uVar14;
  local_1d0 = (FabArrayBase *)this_00;
  if (0 < (int)((ulong)((long)(this->m_range).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) >> 3)) {
    iVar8 = this->m_amrlevel->level;
    local_1d4 = 0;
    lVar12 = 0;
    dcomp = 0;
    local_1f8 = iVar8;
    do {
      iVar15 = ppVar9[lVar12].first;
      ncomp_00 = ppVar9[lVar12].second;
      if (iVar8 == 1) {
LAB_005d8732:
        FillFromTwoLevels(this,local_1f0,idx,iVar15,dcomp,ncomp_00);
      }
      else if (iVar8 == 0) {
        FillFromLevel0(this,local_1f0,idx,iVar15,dcomp,ncomp_00);
      }
      else {
        pAVar3 = this->m_amrlevel;
        iVar1 = pAVar3->level;
        pIVar4 = (pAVar3->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1fc = iVar15;
        pIVar10 = StateDescriptor::interp(local_1e8,iVar15);
        iVar8 = local_1f8;
        bVar7 = ProperlyNested<amrex::InterpBase>
                          (&pAVar3->crse_ratio,pIVar4 + iVar1,boxGrow,&local_1f4,pIVar10);
        iVar15 = local_1fc;
        if (bVar7) goto LAB_005d8732;
        pIVar11 = EB2::TopIndexSpaceIfPresent();
        if (pIVar11 != (IndexSpace *)0x0) {
          Abort_host("Grids must be properly nested for EB");
        }
        if (((Initialize(int,double,int,int,int)::first == '\0') &&
            (Initialize(int,double,int,int,int)::first = '\x01',
            *(int *)(ParallelContext::frames + 0xc) == local_1d4)) &&
           (iVar8 = Verbose(), iVar8 != 0)) {
          iVar8 = this->m_amrlevel->level;
          pIVar4 = (this->m_amrlevel->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.
                   blocking_factor.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)pIVar4[iVar8].vect;
          local_208.vect[1] = (int)((ulong)uVar5 >> 0x20) * 2;
          local_208.vect[0] = (int)uVar5 * 2;
          local_208.vect[2] = pIVar4[iVar8].vect[2] * 2;
          iVar8 = 10;
          do {
            pAVar3 = this->m_amrlevel;
            pIVar10 = StateDescriptor::interp(local_1e8,local_1fc);
            bVar7 = ProperlyNested<amrex::InterpBase>
                              (&pAVar3->crse_ratio,&local_208,boxGrow,&local_1f4,pIVar10);
            if (bVar7) break;
            iVar15 = local_208.vect[0];
            local_208.vect[1] = local_208.vect[1] * 2;
            local_208.vect[0] = iVar15 * 2;
            local_208.vect[2] = local_208.vect[2] << 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          mfi.fabArray = (FabArrayBase *)OutStream();
          mfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
               *(undefined4 *)(DAT_00842950 + -0x30);
          mfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
               *(undefined4 *)(DAT_00842950 + -0x48);
          this_01 = &mfi.tile_size;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
          *(undefined8 *)
           ((long)mfi.tile_size.vect + *(long *)(mfi.tile_size.vect._0_8_ + -0x18) + 8) =
               *(undefined8 *)
                ((long)&((mfi.fabArray)->boxarray).m_bat.m_bat_type +
                (long)(mfi.fabArray)->_vptr_FabArrayBase[-3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,
                     "WARNING: Grids are not properly nested.  We might have to use\n",0x3e);
          this_02 = &mfi.tile_size;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,
                     "         two coarse levels to do fillpatch.  Consider using\n",0x3c);
          Print::~Print((Print *)&mfi);
          if (local_208.vect[2] < 0x80) {
LAB_005d88c2:
            mfi.fabArray = (FabArrayBase *)OutStream();
            mfi.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
                 *(undefined4 *)(DAT_00842950 + -0x30);
            mfi.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
                 *(undefined4 *)(DAT_00842950 + -0x48);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
            *(undefined8 *)
             ((long)mfi.tile_size.vect + *(long *)(mfi.tile_size.vect._0_8_ + -0x18) + 8) =
                 *(undefined8 *)
                  ((long)&((mfi.fabArray)->boxarray).m_bat.m_bat_type +
                  (long)(mfi.fabArray)->_vptr_FabArrayBase[-3]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_02,"         amr.blocking_factor=",0x1d);
            amrex::operator<<((ostream *)this_02,&local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,"\n",1);
          }
          else {
            if (local_208.vect[2] == 0x80) {
              if ((local_208.vect[1] < 0x80) ||
                 ((local_208.vect[1] == 0x80 && (local_208.vect[0] < 0x80)))) goto LAB_005d88c2;
            }
            mfi.fabArray = (FabArrayBase *)OutStream();
            mfi.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
                 *(undefined4 *)(DAT_00842950 + -0x30);
            mfi.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
                 *(undefined4 *)(DAT_00842950 + -0x48);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&mfi.tile_size);
            *(undefined8 *)
             ((long)mfi.tile_size.vect + *(long *)(mfi.tile_size.vect._0_8_ + -0x18) + 8) =
                 *(undefined8 *)
                  ((long)&((mfi.fabArray)->boxarray).m_bat.m_bat_type +
                  (long)(mfi.fabArray)->_vptr_FabArrayBase[-3]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&mfi.tile_size,"         larger amr.blocking_factor.\n",0x25);
          }
          Print::~Print((Print *)&mfi);
        }
        this_03 = (FillPatchIteratorHelper *)operator_new(0x160);
        iVar8 = local_1fc;
        local_1c0 = this->m_amrlevel;
        local_1c8 = this->m_leveldata;
        pIVar10 = StateDescriptor::interp(local_1e8,local_1fc);
        FillPatchIteratorHelper::FillPatchIteratorHelper
                  (this_03,local_1c0,local_1c8,boxGrow,local_1f0,idx,iVar8,ncomp_00,pIVar10);
        MFIter::MFIter(&mfi,local_1d0,'\0');
        if (mfi.currentIndex < mfi.endIndex) {
          do {
            piVar13 = &mfi.currentIndex;
            if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + mfi.currentIndex;
            }
            FillPatchIteratorHelper::fill
                      (this_03,(this->m_fabs).super_FabArray<amrex::FArrayBox>.m_fabs_v.
                               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[*piVar13],dcomp,
                       ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[mfi.currentIndex]);
            MFIter::operator++(&mfi);
          } while (mfi.currentIndex < mfi.endIndex);
        }
        MFIter::~MFIter(&mfi);
        FillPatchIteratorHelper::~FillPatchIteratorHelper(this_03);
        operator_delete(this_03,0x160);
        iVar8 = local_1f8;
      }
      dcomp = ncomp_00 + dcomp;
      lVar12 = lVar12 + 1;
      ppVar9 = (this->m_range).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(this->m_range).
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9)
                           >> 3));
  }
  (*this->m_amrlevel->_vptr_AmrLevel[0x21])
            (local_1f0,this->m_amrlevel,local_1d0,(ulong)(uint)idx,(ulong)local_1dc,0,
             (ulong)local_1d8);
  return;
}

Assistant:

void
FillPatchIterator::Initialize (int  boxGrow,
                               Real time,
                               int  idx,
                               int  scomp,
                               int  ncomp)
{
    BL_PROFILE("FillPatchIterator::Initialize");

    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(0 <= idx && idx < AmrLevel::desc_lst.size());

    const StateDescriptor& desc = AmrLevel::desc_lst[idx];

    m_ncomp = ncomp;
    m_range = desc.sameInterps(scomp,ncomp);

    m_fabs.define(m_leveldata.boxArray(),m_leveldata.DistributionMap(),
                  m_ncomp,boxGrow,MFInfo(),m_leveldata.Factory());

    const Geometry& geom = m_amrlevel.Geom();

    m_fabs.setDomainBndry(std::numeric_limits<Real>::quiet_NaN(), geom);

    const IndexType& boxType = m_leveldata.boxArray().ixType();
    const int level = m_amrlevel.level;

    for (int i = 0, DComp = 0; i < static_cast<int>(m_range.size()); i++)
    {
        const int SComp = m_range[i].first;
        const int NComp = m_range[i].second;

        if (level == 0)
        {
            FillFromLevel0(time, idx, SComp, DComp, NComp);
        }
        else
        {
            if (level == 1 ||
                amrex::ProperlyNested(m_amrlevel.crse_ratio,
                                      m_amrlevel.parent->blockingFactor(m_amrlevel.level),
                                      boxGrow, boxType, desc.interp(SComp)))
            {
                FillFromTwoLevels(time, idx, SComp, DComp, NComp);
            } else {

#ifdef AMREX_USE_EB
                if (EB2::TopIndexSpaceIfPresent()) {
                    amrex::Abort("Grids must be properly nested for EB");
                }
#endif

                static bool first = true;
                if (first) {
                    first = false;
                    if (ParallelDescriptor::IOProcessor() && amrex::Verbose()) {
                        IntVect new_blocking_factor = m_amrlevel.parent->blockingFactor(m_amrlevel.level);
                        new_blocking_factor *= 2;
                        for (int j = 0; j < 10; ++j) {
                            if (amrex::ProperlyNested(m_amrlevel.crse_ratio,
                                                      new_blocking_factor,
                                                      boxGrow, boxType, desc.interp(SComp))) {
                                break;
                            } else {
                                new_blocking_factor *= 2;
                            }
                        }
                        amrex::Print() << "WARNING: Grids are not properly nested.  We might have to use\n"
                                       << "         two coarse levels to do fillpatch.  Consider using\n";
                        if (new_blocking_factor < IntVect{AMREX_D_DECL(128,128,128)}) {
                            amrex::Print() << "         amr.blocking_factor=" << new_blocking_factor << "\n";
                        } else {
                            amrex::Print() << "         larger amr.blocking_factor.\n";
                        }
                    }
                }

                FillPatchIteratorHelper* fph = 0;
                fph = new FillPatchIteratorHelper(m_amrlevel,
                                                  m_leveldata,
                                                  boxGrow,
                                                  time,
                                                  idx,
                                                  SComp,
                                                  NComp,
                                                  desc.interp(SComp));

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(m_fabs); mfi.isValid(); ++mfi)
                {
                    fph->fill(m_fabs[mfi],DComp,mfi.index());
                }

                delete fph;
            }
        }

        DComp += NComp;
    }
    //
    // Call hack to touch up fillPatched data.
    //
    m_amrlevel.set_preferred_boundary_values(m_fabs,
                                             idx,
                                             scomp,
                                             0,
                                             ncomp,
                                             time);
}